

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BriefOperator.cpp
# Opt level: O1

void __thiscall lts2::BriefOperator::initWithPatchSize(BriefOperator *this,Size *patchSize)

{
  BasisFunction *pBVar1;
  IntegratingCell *pIVar2;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  double *pdVar11;
  uint uVar12;
  Size local_30;
  
  local_30.width = patchSize->width;
  local_30.height = patchSize->height;
  LBDOperator::setPatchSize(&this->super_LBDOperator,&local_30);
  pIVar2 = (this->super_LBDOperator)._sensitiveCells;
  if (pIVar2 != (IntegratingCell *)0x0) {
    operator_delete__(pIVar2);
  }
  uVar8 = patchSize->width - 9;
  uVar12 = patchSize->height - 9;
  (this->super_LBDOperator)._patternPoints = uVar12 * uVar8;
  pIVar2 = (IntegratingCell *)
           operator_new__((ulong)(uint)(*(int *)&(this->super_LBDOperator).super_LinearOperator.
                                                 field_0xc * 2) * 0x18);
  (this->super_LBDOperator)._sensitiveCells = pIVar2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Generating ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," pairs.\n",8);
  uVar10 = (ulong)*(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
  if (uVar10 != 0) {
    pBVar1 = (this->super_LBDOperator)._basisFunctions;
    pdVar11 = &(this->super_LBDOperator)._sensitiveCells[1].scaleFactor;
    uVar4 = 0x2a;
    lVar7 = 0;
    do {
      if (uVar8 == 0) {
        iVar6 = 0;
      }
      else {
        uVar4 = (uVar4 >> 0x20) + (uVar4 & 0xffffffff) * 0xf83f630a;
        iVar6 = (int)((uVar4 & 0xffffffff) % (ulong)uVar8);
      }
      iVar9 = 0;
      if (uVar12 == 0) {
        iVar5 = 0;
      }
      else {
        uVar4 = (uVar4 >> 0x20) + (uVar4 & 0xffffffff) * 0xf83f630a;
        iVar5 = (int)((uVar4 & 0xffffffff) % (ulong)uVar12);
      }
      *(int *)(pdVar11 + -5) = iVar6;
      *(int *)(pdVar11 + -4) = iVar5;
      *(int *)((long)pdVar11 + -0x24) = iVar6 + 9;
      *(int *)((long)pdVar11 + -0x1c) = iVar5 + 9;
      pdVar11[-3] = 0.012345679012345678;
      if (uVar8 != 0) {
        uVar4 = (uVar4 >> 0x20) + (uVar4 & 0xffffffff) * 0xf83f630a;
        iVar9 = (int)((uVar4 & 0xffffffff) % (ulong)uVar8);
      }
      if (uVar12 == 0) {
        iVar6 = 0;
      }
      else {
        uVar4 = (uVar4 >> 0x20) + (uVar4 & 0xffffffff) * 0xf83f630a;
        iVar6 = (int)((uVar4 & 0xffffffff) % (ulong)uVar12);
      }
      ((IntegratingCell *)(pdVar11 + -2))->xmin = iVar9;
      *(int *)(pdVar11 + -1) = iVar6;
      *(int *)((long)pdVar11 + -0xc) = iVar9 + 9;
      *(int *)((long)pdVar11 + -4) = iVar6 + 9;
      *pdVar11 = 0.012345679012345678;
      (&pBVar1->pos_cell)[lVar7] = (uint)lVar7;
      (&pBVar1->neg_cell)[lVar7] = (uint)lVar7 + 1;
      pdVar11 = pdVar11 + 6;
      lVar7 = lVar7 + 2;
    } while (uVar10 * 2 != lVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Done !\n",7);
  return;
}

Assistant:

void lts2::BriefOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);

    cv::RNG rng(42);

    // Only 9x9 patches (except borders)
    int const detectorRadius = 9 / 2;

    // Reset
    if (_sensitiveCells)
      delete[] _sensitiveCells;

    // Points where we can have a sensitive cell
    int usefulWidth = patchSize.width - 9;
    int usefulHeight = patchSize.height - 9;
    _patternPoints = usefulWidth*usefulHeight;
    _sensitiveCells = new lbd::IntegratingCell[2*_pairsInUse];

    double invCellArea = 1.0/81.0;

    std::cerr << "Generating " << _pairsInUse << " pairs.\n";

    for (int i = 0; i < _pairsInUse; ++i)
    {
      unsigned int x_pos = rng(usefulWidth);
      unsigned int y_pos = rng(usefulHeight);

      _sensitiveCells[2*i].xmin = x_pos;
      _sensitiveCells[2*i].ymin = y_pos;
      _sensitiveCells[2*i].xmax = x_pos + 9;
      _sensitiveCells[2*i].ymax = y_pos + 9;
      _sensitiveCells[2*i].scaleFactor = invCellArea;

      unsigned int x_neg = rng(usefulWidth);
      unsigned int y_neg = rng(usefulHeight);

      _sensitiveCells[2*i+1].xmin = x_neg;
      _sensitiveCells[2*i+1].ymin = y_neg;
      _sensitiveCells[2*i+1].xmax = x_neg + 9;
      _sensitiveCells[2*i+1].ymax = y_neg + 9;
      _sensitiveCells[2*i+1].scaleFactor = invCellArea;

      _basisFunctions[i].pos_cell = 2*i;
      _basisFunctions[i].neg_cell = 2*i+1;
    }
    std::cerr << "Done !\n";
}